

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

void double_conversion::DoubleToStringConverter::DoubleToAscii
               (double v,DtoaMode mode,int requested_digits,char *buffer,int buffer_length,
               bool *sign,int *length,int *point)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  DtoaMode in_EDI;
  undefined1 *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  undefined4 *in_stack_00000008;
  BignumDtoaMode bignum_mode;
  bool fast_worked;
  undefined4 in_stack_00000028;
  Vector<char> in_stack_00000060;
  Vector<char> vector;
  double in_stack_ffffffffffffff48;
  Double *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar4;
  FastDtoaMode mode_00;
  undefined4 in_stack_ffffffffffffff70;
  double local_78;
  char *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  Vector<char>::Vector((Vector<char> *)local_18,in_RDX,in_ECX);
  Double::Double(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  iVar2 = Double::Sign(in_stack_ffffffffffffff50);
  if (iVar2 < 0) {
    *in_R8 = 1;
    local_78 = -in_XMM0_Qa;
  }
  else {
    *in_R8 = 0;
    local_78 = in_XMM0_Qa;
  }
  if ((in_EDI == PRECISION) && (in_ESI == 0)) {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)local_18,0);
    *pcVar3 = '\0';
    *in_R9 = 0;
  }
  else if ((local_78 != 0.0) || (NAN(local_78))) {
    uVar4 = CONCAT13(0xaa,(int3)in_stack_ffffffffffffff5c);
    iVar2 = (int)in_R8;
    mode_00 = (FastDtoaMode)((ulong)in_R8 >> 0x20);
    switch(in_EDI) {
    case SHORTEST:
      buffer_01._8_8_ = in_stack_ffffffffffffffa8;
      buffer_01.start_ = in_stack_ffffffffffffffa0;
      bVar1 = FastDtoa((double)CONCAT44(in_ECX,in_stack_ffffffffffffff70),mode_00,iVar2,buffer_01,
                       in_R9,(int *)CONCAT44(uVar4,in_stack_ffffffffffffff58));
      break;
    case SHORTEST_SINGLE:
      buffer_02._8_8_ = in_stack_ffffffffffffffa8;
      buffer_02.start_ = in_stack_ffffffffffffffa0;
      in_stack_ffffffffffffffc8 = (int *)local_18._0_8_;
      bVar1 = FastDtoa((double)CONCAT44(in_ECX,in_stack_ffffffffffffff70),mode_00,iVar2,buffer_02,
                       in_R9,(int *)CONCAT44(uVar4,in_stack_ffffffffffffff58));
      break;
    case FIXED:
      in_stack_ffffffffffffffb8 = (int *)local_18._0_8_;
      in_stack_ffffffffffffffc0 = (int *)local_18._8_8_;
      bVar1 = FastFixedDtoa((double)local_18._8_8_,SUB84(local_18._0_8_,4),in_stack_00000060,
                            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      break;
    case PRECISION:
      buffer_03._8_8_ = local_18._0_8_;
      buffer_03.start_ = in_stack_ffffffffffffffa0;
      in_stack_ffffffffffffffb0 = (int *)local_18._8_8_;
      bVar1 = FastDtoa((double)CONCAT44(in_ECX,in_stack_ffffffffffffff70),mode_00,iVar2,buffer_03,
                       in_R9,(int *)CONCAT44(uVar4,in_stack_ffffffffffffff58));
      break;
    default:
      abort();
    }
    if (bVar1 == false) {
      DtoaToBignumDtoaMode(in_EDI);
      buffer_00.start_._4_4_ = buffer_length;
      buffer_00.start_._0_4_ = in_stack_00000028;
      buffer_00._8_8_ = buffer;
      BignumDtoa((double)in_stack_ffffffffffffffc8,
                 (BignumDtoaMode)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 (int)in_stack_ffffffffffffffc0,buffer_00,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
      pcVar3 = Vector<char>::operator[]((Vector<char> *)local_18,*in_R9);
      *pcVar3 = '\0';
    }
  }
  else {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)local_18,0);
    *pcVar3 = '0';
    pcVar3 = Vector<char>::operator[]((Vector<char> *)local_18,1);
    *pcVar3 = '\0';
    *in_R9 = 1;
    *in_stack_00000008 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DoubleToStringConverter::DoubleToAscii(double v,
                                            DtoaMode mode,
                                            int requested_digits,
                                            char* buffer,
                                            int buffer_length,
                                            bool* sign,
                                            int* length,
                                            int* point) {
  Vector<char> vector(buffer, buffer_length);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  DOUBLE_CONVERSION_ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0);

  if (Double(v).Sign() < 0) {
    *sign = true;
    v = -v;
  } else {
    *sign = false;
  }

  if (mode == PRECISION && requested_digits == 0) {
    vector[0] = '\0';
    *length = 0;
    return;
  }

  if (v == 0) {
    vector[0] = '0';
    vector[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }

  bool fast_worked;
  switch (mode) {
    case SHORTEST:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST, 0, vector, length, point);
      break;
    case SHORTEST_SINGLE:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0,
                             vector, length, point);
      break;
    case FIXED:
      fast_worked = FastFixedDtoa(v, requested_digits, vector, length, point);
      break;
    case PRECISION:
      fast_worked = FastDtoa(v, FAST_DTOA_PRECISION, requested_digits,
                             vector, length, point);
      break;
    default:
      fast_worked = false;
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (fast_worked) return;

  // If the fast dtoa didn't succeed use the slower bignum version.
  BignumDtoaMode bignum_mode = DtoaToBignumDtoaMode(mode);
  BignumDtoa(v, bignum_mode, requested_digits, vector, length, point);
  vector[*length] = '\0';
}